

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

void QApplication::setPalette(QPalette *palette,char *className)

{
  size_t sVar1;
  size_t extraout_RDX;
  long in_FS_OFFSET;
  iterator iVar2;
  QByteArray local_50;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (className == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QGuiApplication::setPalette(palette);
      return;
    }
  }
  else {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_38,palette);
    if (QApplicationPrivate::app_style != (QStyle *)0x0) {
      QPalette::resolveMask();
      (**(code **)(*(long *)QApplicationPrivate::app_style + 0x80))
                (QApplicationPrivate::app_style,local_38);
      QPalette::setResolveMask((ulonglong)local_38);
    }
    QByteArray::QByteArray(&local_50,className,-1);
    iVar2 = QHash<QByteArray,QPalette>::emplace<QPalette_const&>
                      ((QHash<QByteArray,QPalette> *)&QApplicationPrivate::widgetPalettes,&local_50,
                       (QPalette *)local_38);
    sVar1 = iVar2.i.bucket;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        sVar1 = extraout_RDX;
      }
    }
    if (QCoreApplication::self != 0) {
      (**(code **)(**(long **)(QCoreApplication::self + 8) + 0xa0))
                (*(long **)(QCoreApplication::self + 8),className,sVar1);
    }
    QPalette::~QPalette((QPalette *)local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QApplication::setPalette(const QPalette &palette, const char* className)
{
    if (className) {
        QPalette polishedPalette = palette;
        if (QApplicationPrivate::app_style) {
            auto originalResolveMask = palette.resolveMask();
            QApplicationPrivate::app_style->polish(polishedPalette);
            polishedPalette.setResolveMask(originalResolveMask);
        }

        QApplicationPrivate::widgetPalettes.insert(className, polishedPalette);
        if (qApp)
            qApp->d_func()->handlePaletteChanged(className);
    } else {
        QGuiApplication::setPalette(palette);
    }
}